

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

ssize_t ossl_send(Curl_cfilter *cf,Curl_easy *data,void *mem,size_t len,CURLcode *curlcode)

{
  void *pvVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  uint *puVar6;
  CURLcode CVar7;
  size_t sVar8;
  char *pcVar9;
  char error_buffer [256];
  char acStack_138 [264];
  
  pvVar1 = cf->ctx;
  lVar2 = *(long *)((long)pvVar1 + 0x30);
  ERR_clear_error();
  *(undefined4 *)((long)pvVar1 + 0x58) = 0;
  sVar8 = 0x7fffffff;
  if (len < 0x7fffffff) {
    sVar8 = len;
  }
  uVar3 = SSL_write(*(SSL **)(lVar2 + 8),mem,(int)sVar8);
  if (0 < (int)uVar3) {
    *curlcode = CURLE_OK;
    return (ulong)uVar3;
  }
  iVar4 = SSL_get_error(*(SSL **)(lVar2 + 8),uVar3);
  switch(iVar4) {
  case 0:
    pcVar9 = "SSL_ERROR_NONE";
    break;
  case 1:
    uVar5 = ERR_get_error();
    pcVar9 = ossl_strerror(uVar5,acStack_138,0x100);
    Curl_failf(data,"SSL_write() error: %s",pcVar9);
    goto LAB_0016a548;
  case 2:
    *(undefined4 *)((long)pvVar1 + 0x58) = 1;
  case 3:
    *curlcode = CURLE_AGAIN;
    return -1;
  case 4:
    pcVar9 = "SSL_ERROR_WANT_X509_LOOKUP";
    break;
  case 5:
    puVar6 = (uint *)__errno_location();
    CVar7 = CURLE_AGAIN;
    if (*(int *)(lVar2 + 0x20) != 0x51) {
      uVar3 = *puVar6;
      uVar5 = ERR_get_error();
      if (uVar5 == 0) {
        if (uVar3 == 0) {
          curl_msnprintf(acStack_138,0x100,"%s","SSL_ERROR_SYSCALL");
        }
        else {
          Curl_strerror(uVar3,acStack_138,0x100);
        }
      }
      else {
        ossl_strerror(uVar5,acStack_138,0x100);
      }
      Curl_failf(data,"OpenSSL SSL_write: %s, errno %d",acStack_138,(ulong)uVar3);
      CVar7 = CURLE_SEND_ERROR;
    }
    *curlcode = CVar7;
    return -1;
  case 6:
    pcVar9 = "SSL_ERROR_ZERO_RETURN";
    break;
  case 7:
    pcVar9 = "SSL_ERROR_WANT_CONNECT";
    break;
  case 8:
    pcVar9 = "SSL_ERROR_WANT_ACCEPT";
    break;
  case 9:
    pcVar9 = "SSL_ERROR_WANT_ASYNC";
    break;
  case 10:
    pcVar9 = "SSL_ERROR_WANT_ASYNC_JOB";
    break;
  default:
    pcVar9 = "SSL_ERROR unknown";
  }
  puVar6 = (uint *)__errno_location();
  Curl_failf(data,"OpenSSL SSL_write: %s, errno %d",pcVar9,(ulong)*puVar6);
LAB_0016a548:
  *curlcode = CURLE_SEND_ERROR;
  return -1;
}

Assistant:

static ssize_t ossl_send(struct Curl_cfilter *cf,
                         struct Curl_easy *data,
                         const void *mem,
                         size_t len,
                         CURLcode *curlcode)
{
  /* SSL_write() is said to return 'int' while write() and send() returns
     'size_t' */
  int err;
  char error_buffer[256];
  sslerr_t sslerror;
  int memlen;
  int rc;
  struct ssl_connect_data *connssl = cf->ctx;
  struct ossl_ctx *octx = (struct ossl_ctx *)connssl->backend;

  (void)data;
  DEBUGASSERT(octx);

  ERR_clear_error();

  connssl->io_need = CURL_SSL_IO_NEED_NONE;
  memlen = (len > (size_t)INT_MAX) ? INT_MAX : (int)len;
  rc = SSL_write(octx->ssl, mem, memlen);

  if(rc <= 0) {
    err = SSL_get_error(octx->ssl, rc);

    switch(err) {
    case SSL_ERROR_WANT_READ:
      connssl->io_need = CURL_SSL_IO_NEED_RECV;
      *curlcode = CURLE_AGAIN;
      rc = -1;
      goto out;
    case SSL_ERROR_WANT_WRITE:
      *curlcode = CURLE_AGAIN;
      rc = -1;
      goto out;
    case SSL_ERROR_SYSCALL:
    {
      int sockerr = SOCKERRNO;

      if(octx->io_result == CURLE_AGAIN) {
        *curlcode = CURLE_AGAIN;
        rc = -1;
        goto out;
      }
      sslerror = ERR_get_error();
      if(sslerror)
        ossl_strerror(sslerror, error_buffer, sizeof(error_buffer));
      else if(sockerr)
        Curl_strerror(sockerr, error_buffer, sizeof(error_buffer));
      else
        msnprintf(error_buffer, sizeof(error_buffer), "%s",
                  SSL_ERROR_to_str(err));

      failf(data, OSSL_PACKAGE " SSL_write: %s, errno %d",
            error_buffer, sockerr);
      *curlcode = CURLE_SEND_ERROR;
      rc = -1;
      goto out;
    }
    case SSL_ERROR_SSL: {
      /*  A failure in the SSL library occurred, usually a protocol error.
          The OpenSSL error queue contains more information on the error. */
      sslerror = ERR_get_error();
      failf(data, "SSL_write() error: %s",
            ossl_strerror(sslerror, error_buffer, sizeof(error_buffer)));
      *curlcode = CURLE_SEND_ERROR;
      rc = -1;
      goto out;
    }
    default:
      /* a true error */
      failf(data, OSSL_PACKAGE " SSL_write: %s, errno %d",
            SSL_ERROR_to_str(err), SOCKERRNO);
      *curlcode = CURLE_SEND_ERROR;
      rc = -1;
      goto out;
    }
  }
  *curlcode = CURLE_OK;

out:
  return (ssize_t)rc; /* number of bytes */
}